

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_deduc.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  string local_c0 [8];
  string _listinit_type;
  string local_a0 [8];
  string _dbl_type;
  string local_80 [8];
  string _str_type;
  string local_60 [8];
  string _int_type;
  char *local_40;
  char *local_38;
  char **local_30;
  initializer_list<const_char_*> _listinit;
  double _dbl;
  char *_str;
  int _int;
  
  _listinit._M_len = 0x4037800000000000;
  local_40 = "List";
  local_38 = "Init";
  local_30 = &local_40;
  _listinit._M_array = (iterator)0x2;
  std::__cxx11::string::string(local_60);
  std::__cxx11::string::string(local_80);
  std::__cxx11::string::string(local_a0);
  std::__cxx11::string::string(local_c0);
  pcVar2 = std::type_info::name((type_info *)&int::typeinfo);
  iVar1 = strcmp(pcVar2,"i");
  if (iVar1 == 0) {
    std::__cxx11::string::operator=(local_60,"int");
  }
  else {
    std::__cxx11::string::operator=(local_60,"unknown/non-gcc/clang compiler");
  }
  pcVar2 = std::type_info::name((type_info *)&double::typeinfo);
  iVar1 = strcmp(pcVar2,"d");
  if (iVar1 == 0) {
    std::__cxx11::string::operator=(local_a0,"double");
  }
  else {
    std::__cxx11::string::operator=(local_a0,"unknown/non-gcc/clang compiler");
  }
  pcVar2 = std::type_info::name((type_info *)&char_const*::typeinfo);
  iVar1 = strcmp(pcVar2,"PKc");
  if (iVar1 == 0) {
    std::__cxx11::string::operator=(local_80,"std::string");
  }
  else {
    std::__cxx11::string::operator=(local_80,"unknown/non-gcc/clang compiler");
  }
  pcVar2 = std::type_info::name((type_info *)&std::initializer_list<char_const*>::typeinfo);
  iVar1 = strcmp(pcVar2,"St16initializer_listIPKcE");
  if (iVar1 == 0) {
    std::__cxx11::string::operator=(local_c0,"std::initializer_list<char const*>");
  }
  else {
    std::__cxx11::string::operator=(local_c0,"unknown/non-gcc/clang compiler");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\n");
  poVar3 = std::operator<<(poVar3,"\"_int\": ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,9);
  poVar3 = std::operator<<(poVar3," is an ");
  poVar3 = std::operator<<(poVar3,local_60);
  poVar3 = std::operator<<(poVar3,".\n");
  poVar3 = std::operator<<(poVar3,"\"_dbl\": ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,9);
  poVar3 = std::operator<<(poVar3," is an ");
  poVar3 = std::operator<<(poVar3,local_a0);
  poVar3 = std::operator<<(poVar3,".\n");
  poVar3 = std::operator<<(poVar3,"\"_str\": ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,9);
  poVar3 = std::operator<<(poVar3," is an ");
  poVar3 = std::operator<<(poVar3,local_80);
  poVar3 = std::operator<<(poVar3,".\n");
  poVar3 = std::operator<<(poVar3,"\"_listinit\": ");
  poVar3 = std::operator<<(poVar3,"{\"List\", \"Init\"}");
  poVar3 = std::operator<<(poVar3," is an ");
  poVar3 = std::operator<<(poVar3,local_c0);
  poVar3 = std::operator<<(poVar3,".\n");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  return 0;
}

Assistant:

int main() {
	auto _int {9};
	auto _str {"Marc-Elie"};
	auto _dbl {23.5};
	//It's a shame std::initializer_list<> is not subscriptable :/
	auto _listinit = { "List", "Init"};
	std::string _int_type,_str_type,_dbl_type,_listinit_type;

	/* This solution is not portable across compilers--
		The result of std::type_info.name() is mangled
		on gcc and clang but IBM, Oracle, and MSVC
		provide human readable names. */

	if ( std::strcmp((typeid(_int).name()), "i") == 0 ) { _int_type = "int"; }
	else { _int_type = "unknown/non-gcc/clang compiler"; }

	if ( std::strcmp((typeid(_dbl).name()), "d") == 0 ) { _dbl_type = "double"; }
	else { _dbl_type = "unknown/non-gcc/clang compiler"; }

	if ( std::strcmp((typeid(_str).name()), "PKc") == 0 ) { _str_type = "std::string"; }
	else { _str_type = "unknown/non-gcc/clang compiler"; }

	if ( std::strcmp((typeid(_listinit).name()), "St16initializer_listIPKcE") == 0 ) 
		 { _listinit_type = "std::initializer_list<char const*>"; }
	else { _listinit_type = "unknown/non-gcc/clang compiler"; }

	//Print the values and their types
	std::cout << "\n"
		<<"\"_int\": " << _int << " is an " << _int_type << ".\n"
		<<"\"_dbl\": " << _int << " is an " << _dbl_type << ".\n"
		<<"\"_str\": " << _int << " is an " << _str_type << ".\n"
		<<"\"_listinit\": " << "{\"List\", \"Init\"}"<< " is an " << _listinit_type << ".\n"
		<<std::endl;
}